

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O1

double __thiscall chrono::ChConstraintThreeGeneric::Compute_Cq_q(ChConstraintThreeGeneric *this)

{
  ChVariables *pCVar1;
  double dVar2;
  Scalar SVar3;
  scalar_sum_op<double,_double> local_81;
  double *local_80;
  Scalar local_78;
  double local_70;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_68;
  PointerType local_50;
  long local_48;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
  local_38;
  
  pCVar1 = (this->super_ChConstraintThree).variables_a;
  dVar2 = 0.0;
  if (pCVar1->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)&local_50,pCVar1);
    if ((this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
        != local_48) goto LAB_007f515c;
    local_68.m_lhs.m_matrix = &this->Cq_a;
    local_80 = &local_78;
    SVar3 = 0.0;
    local_68.m_rhs = (ChVectorRef *)&local_50;
    if (local_48 != 0) {
      if (local_48 < 1) goto LAB_007f517b;
      local_38.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
      .
      super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data =
           (evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>)
           ((local_68.m_lhs.m_matrix)->
           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.m_data;
      local_38.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = local_50;
      local_38.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = local_48;
      SVar3 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>const>>,3,0>
              ::
              run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>const>>
                        (&local_38,&local_81,&local_68);
    }
    dVar2 = *local_80 + 0.0;
    local_78 = SVar3;
  }
  pCVar1 = (this->super_ChConstraintThree).variables_b;
  if (pCVar1->disabled == false) {
    local_70 = dVar2;
    ChVariables::Get_qb((ChVectorRef *)&local_50,pCVar1);
    if ((this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
        != local_48) goto LAB_007f515c;
    local_68.m_lhs.m_matrix = &this->Cq_b;
    local_80 = &local_78;
    local_68.m_rhs = (ChVectorRef *)&local_50;
    if (local_48 == 0) {
      local_78 = 0.0;
    }
    else {
      if (local_48 < 1) goto LAB_007f517b;
      local_38.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
      .
      super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data =
           (evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>)
           ((local_68.m_lhs.m_matrix)->
           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.m_data;
      local_38.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = local_50;
      local_38.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = local_48;
      local_78 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>const>>
                           (&local_38,&local_81,&local_68);
    }
    dVar2 = local_70 + *local_80;
  }
  pCVar1 = (this->super_ChConstraintThree).variables_c;
  if (pCVar1->disabled == false) {
    local_70 = dVar2;
    ChVariables::Get_qb((ChVectorRef *)&local_50,pCVar1);
    if ((this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
        != local_48) {
LAB_007f515c:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::Matrix<double, 1, -1>, Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 1, -1>, Rhs = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Option = 0]"
                   );
    }
    local_68.m_lhs.m_matrix = &this->Cq_c;
    local_80 = &local_78;
    if (local_48 != 0) {
      if (local_48 < 1) {
LAB_007f517b:
        local_68.m_rhs = (RhsNested)&local_50;
        local_80 = &local_78;
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, 1, -1>>, const Eigen::Ref<Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, 1, -1>>, const Eigen::Ref<Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                     );
      }
      local_38.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
      .
      super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data =
           (evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>)
           ((local_68.m_lhs.m_matrix)->
           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.m_data;
      local_38.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = local_50;
      local_38.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = local_48;
      local_68.m_rhs = (ChVectorRef *)&local_50;
      Eigen::internal::
      redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>const>>,3,0>
      ::
      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>const>>
                (&local_38,&local_81,&local_68);
    }
    dVar2 = local_70 + *local_80;
  }
  return dVar2;
}

Assistant:

double ChConstraintThreeGeneric::Compute_Cq_q() {
    double ret = 0;

    if (variables_a->IsActive()) {
        ret += Cq_a * variables_a->Get_qb();
    }

    if (variables_b->IsActive()) {
        ret += Cq_b * variables_b->Get_qb();
    }

    if (variables_c->IsActive()) {
        ret += Cq_c * variables_c->Get_qb();
    }

    return ret;
}